

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O3

boolean encode_mcu_huff(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  byte bVar1;
  code cVar2;
  undefined4 uVar3;
  jpeg_entropy_encoder *pjVar4;
  _func_void_j_compress_ptr *p_Var5;
  jpeg_error_mgr *pjVar6;
  jpeg_destination_mgr *pjVar7;
  bool bVar8;
  undefined8 uVar9;
  j_compress_ptr pjVar10;
  uint uVar11;
  boolean bVar12;
  long lVar13;
  JOCTET *pJVar14;
  uint uVar15;
  size_t sVar16;
  int iVar17;
  long lVar18;
  _func_void_j_compress_ptr_boolean *p_Var19;
  ulong uVar20;
  _func_void_j_compress_ptr_boolean *p_Var21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  undefined1 local_c0 [28];
  int iStack_a4;
  _func_void_j_compress_ptr *local_a0;
  _func_void_j_compress_ptr_boolean *p_Stack_98;
  j_compress_ptr local_90;
  ulong local_88;
  JBLOCKROW *local_80;
  ulong local_78;
  ulong local_70;
  _func_void_j_compress_ptr_boolean *local_68;
  int *local_60;
  JBLOCKROW local_58;
  j_compress_ptr local_50;
  jpeg_entropy_encoder *local_48;
  long local_40;
  long local_38;
  
  pjVar4 = cinfo->entropy;
  local_c0._0_8_ = cinfo->dest->next_output_byte;
  local_c0._8_8_ = cinfo->dest->free_in_buffer;
  local_c0._16_8_ = pjVar4[1].start_pass;
  unique0x10000391 = pjVar4[1].encode_mcu;
  local_a0 = pjVar4[1].finish_pass;
  p_Stack_98 = pjVar4[2].start_pass;
  local_90 = cinfo;
  if ((cinfo->restart_interval != 0) && (*(int *)&pjVar4[2].encode_mcu == 0)) {
    uVar3 = *(undefined4 *)((long)&pjVar4[2].encode_mcu + 4);
    local_80 = MCU_data;
    bVar12 = flush_bits_s((working_state *)local_c0);
    if (bVar12 == 0) {
      return 0;
    }
    pJVar14 = (JOCTET *)(local_c0._0_8_ + 1);
    *(JOCTET *)local_c0._0_8_ = 0xff;
    local_c0._8_8_ = local_c0._8_8_ - 1;
    if (local_c0._8_8_ == 0) {
      pjVar7 = local_90->dest;
      local_c0._0_8_ = pJVar14;
      bVar12 = (*pjVar7->empty_output_buffer)(local_90);
      if (bVar12 == 0) {
        return 0;
      }
      pJVar14 = pjVar7->next_output_byte;
      local_c0._8_8_ = pjVar7->free_in_buffer;
    }
    pjVar10 = local_90;
    local_c0._0_8_ = pJVar14 + 1;
    *pJVar14 = (char)uVar3 + 0xd0;
    local_c0._8_8_ = local_c0._8_8_ - 1;
    if (local_c0._8_8_ == 0) {
      pjVar7 = local_90->dest;
      bVar12 = (*pjVar7->empty_output_buffer)(local_90);
      if (bVar12 == 0) {
        return 0;
      }
      local_c0._0_8_ = pjVar7->next_output_byte;
      local_c0._8_8_ = pjVar7->free_in_buffer;
    }
    MCU_data = local_80;
    if (0 < pjVar10->comps_in_scan) {
      lVar18 = 0;
      do {
        (&iStack_a4)[lVar18] = 0;
        lVar18 = lVar18 + 1;
      } while (lVar18 < pjVar10->comps_in_scan);
    }
  }
  sVar16 = local_c0._8_8_;
  local_48 = pjVar4;
  if (0 < cinfo->blocks_in_MCU) {
    local_38 = 0;
    local_50 = cinfo;
    local_80 = MCU_data;
    do {
      pjVar10 = local_90;
      local_40 = (long)local_50->MCU_membership[local_38];
      local_58 = MCU_data[local_38];
      iVar22 = (int)(*MCU_data[local_38])[0];
      local_88 = (ulong)(uint)(iVar22 - (&iStack_a4)[local_40]);
      p_Var5 = (&local_48[2].finish_pass)[local_50->cur_comp_info[local_40]->dc_tbl_no];
      local_68 = (&local_48[4].start_pass)[local_50->cur_comp_info[local_40]->ac_tbl_no];
      local_70 = (ulong)(uint)local_90->lim_Se;
      local_60 = local_90->natural_order;
      uVar24 = 0;
      uVar23 = iVar22 - (&iStack_a4)[local_40];
      if (uVar23 != 0) {
        uVar20 = (ulong)-uVar23;
        if (0 < (int)uVar23) {
          uVar20 = (ulong)uVar23;
        }
        uVar11 = 0xffffffff;
        do {
          uVar24 = uVar11;
          uVar11 = uVar24 + 1;
          uVar15 = (uint)uVar20;
          uVar20 = uVar20 >> 1;
        } while (1 < uVar15);
        uVar24 = uVar24 + 2;
        if (10 < uVar11) {
          pjVar6 = local_90->err;
          pjVar6->msg_code = 6;
          (*pjVar6->error_exit)((j_common_ptr)local_90);
        }
      }
      local_78 = (ulong)uVar23;
      uVar20 = (ulong)uVar24;
      uVar23 = *(uint *)(p_Var5 + uVar20 * 4);
      bVar1 = (byte)p_Var5[uVar20 + 0x400];
      uVar3 = local_c0._24_4_;
      if (bVar1 == 0) {
        pjVar6 = pjVar10->err;
        pjVar6->msg_code = 0x29;
        (*pjVar6->error_exit)((j_common_ptr)pjVar10);
      }
      uVar11 = uVar3 + (int)(char)bVar1;
      p_Var19 = (_func_void_j_compress_ptr_boolean *)
                ((ulong)(uVar23 & ~(uint)(-1L << (bVar1 & 0x3f))) << (0x18U - (char)uVar11 & 0x3f) |
                local_c0._16_8_);
      uVar23 = uVar11;
      if (7 < (int)uVar11) {
        do {
          pJVar14 = (JOCTET *)(local_c0._0_8_ + 1);
          *(JOCTET *)local_c0._0_8_ = (JOCTET)((ulong)p_Var19 >> 0x10);
          local_c0._8_8_ = local_c0._8_8_ - 1;
          local_c0._0_8_ = pJVar14;
          if (local_c0._8_8_ == 0) {
            pjVar7 = local_90->dest;
            bVar12 = (*pjVar7->empty_output_buffer)(local_90);
            if (bVar12 == 0) {
              return 0;
            }
            local_c0._0_8_ = pjVar7->next_output_byte;
            local_c0._8_8_ = pjVar7->free_in_buffer;
          }
          if ((~(uint)p_Var19 & 0xff0000) == 0) {
            pJVar14 = (JOCTET *)(local_c0._0_8_ + 1);
            *(JOCTET *)local_c0._0_8_ = '\0';
            local_c0._8_8_ = local_c0._8_8_ - 1;
            local_c0._0_8_ = pJVar14;
            if (local_c0._8_8_ == 0) {
              pjVar7 = local_90->dest;
              bVar12 = (*pjVar7->empty_output_buffer)(local_90);
              if (bVar12 == 0) {
                return 0;
              }
              local_c0._0_8_ = pjVar7->next_output_byte;
              local_c0._8_8_ = pjVar7->free_in_buffer;
            }
          }
          p_Var19 = (_func_void_j_compress_ptr_boolean *)((long)p_Var19 << 8);
          uVar11 = uVar23 - 8;
          bVar8 = 0xf < (int)uVar23;
          sVar16 = local_c0._8_8_;
          uVar23 = uVar11;
        } while (bVar8);
      }
      stack0xffffffffffffff58 =
           (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)CONCAT44(iStack_a4,uVar11);
      if (uVar20 != 0) {
        uVar11 = uVar11 + uVar24;
        p_Var21 = (_func_void_j_compress_ptr_boolean *)
                  ((ulong)(~(uint)(-1L << ((byte)uVar24 & 0x3f)) &
                          (int)local_78 + ((int)local_88 >> 0x1f)) << (0x18U - (char)uVar11 & 0x3f)
                  | (ulong)p_Var19);
        uVar24 = uVar11;
        local_c0._16_8_ = p_Var19;
        if (7 < (int)uVar11) {
          do {
            pJVar14 = (JOCTET *)(local_c0._0_8_ + 1);
            *(JOCTET *)local_c0._0_8_ = (JOCTET)((ulong)p_Var21 >> 0x10);
            local_c0._8_8_ = local_c0._8_8_ - 1;
            local_c0._0_8_ = pJVar14;
            if (local_c0._8_8_ == 0) {
              pjVar7 = local_90->dest;
              bVar12 = (*pjVar7->empty_output_buffer)(local_90);
              if (bVar12 == 0) {
                return 0;
              }
              local_c0._0_8_ = pjVar7->next_output_byte;
              local_c0._8_8_ = pjVar7->free_in_buffer;
            }
            if ((~(uint)p_Var21 & 0xff0000) == 0) {
              pJVar14 = (JOCTET *)(local_c0._0_8_ + 1);
              *(JOCTET *)local_c0._0_8_ = '\0';
              local_c0._8_8_ = local_c0._8_8_ - 1;
              local_c0._0_8_ = pJVar14;
              if (local_c0._8_8_ == 0) {
                pjVar7 = local_90->dest;
                bVar12 = (*pjVar7->empty_output_buffer)(local_90);
                if (bVar12 == 0) {
                  return 0;
                }
                local_c0._0_8_ = pjVar7->next_output_byte;
                local_c0._8_8_ = pjVar7->free_in_buffer;
              }
            }
            p_Var21 = (_func_void_j_compress_ptr_boolean *)((long)p_Var21 << 8);
            uVar11 = uVar24 - 8;
            bVar8 = 0xf < (int)uVar24;
            sVar16 = local_c0._8_8_;
            uVar24 = uVar11;
          } while (bVar8);
        }
        p_Var19 = p_Var21;
        stack0xffffffffffffff58 =
             (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)CONCAT44(iStack_a4,uVar11);
      }
      local_c0._16_8_ = p_Var19;
      if (0 < (int)local_70) {
        lVar18 = 1;
        uVar20 = ~local_70;
        do {
          uVar9 = local_c0._16_8_;
          uVar24 = 0;
          lVar13 = lVar18;
          while( true ) {
            lVar18 = lVar13 + 1;
            if ((*local_58)[local_60[lVar13]] != 0) break;
            uVar24 = uVar24 + 1;
            lVar13 = lVar18;
            if (uVar20 + lVar18 == 0) {
              uVar24 = *(uint *)local_68;
              cVar2 = local_68[0x400];
              if (cVar2 == (code)0x0) {
                pjVar6 = local_90->err;
                pjVar6->msg_code = 0x29;
                (*pjVar6->error_exit)((j_common_ptr)local_90);
              }
              iVar22 = uVar11 + (int)(char)cVar2;
              p_Var19 = (_func_void_j_compress_ptr_boolean *)
                        (uVar9 | (ulong)(uVar24 & ~(uint)(-1L << ((byte)cVar2 & 0x3f))) <<
                                 (0x18U - (char)iVar22 & 0x3f));
              iVar17 = iVar22;
              if (7 < iVar22) {
                do {
                  pJVar14 = (JOCTET *)(local_c0._0_8_ + 1);
                  *(JOCTET *)local_c0._0_8_ = (JOCTET)((ulong)p_Var19 >> 0x10);
                  local_c0._8_8_ = local_c0._8_8_ - 1;
                  local_c0._0_8_ = pJVar14;
                  if (local_c0._8_8_ == 0) {
                    pjVar7 = local_90->dest;
                    bVar12 = (*pjVar7->empty_output_buffer)(local_90);
                    if (bVar12 == 0) {
                      return 0;
                    }
                    local_c0._0_8_ = pjVar7->next_output_byte;
                    local_c0._8_8_ = pjVar7->free_in_buffer;
                  }
                  if ((~(uint)p_Var19 & 0xff0000) == 0) {
                    pJVar14 = (JOCTET *)(local_c0._0_8_ + 1);
                    *(JOCTET *)local_c0._0_8_ = '\0';
                    local_c0._8_8_ = local_c0._8_8_ - 1;
                    local_c0._0_8_ = pJVar14;
                    if (local_c0._8_8_ == 0) {
                      pjVar7 = local_90->dest;
                      bVar12 = (*pjVar7->empty_output_buffer)(local_90);
                      if (bVar12 == 0) {
                        return 0;
                      }
                      local_c0._0_8_ = pjVar7->next_output_byte;
                      local_c0._8_8_ = pjVar7->free_in_buffer;
                    }
                  }
                  p_Var19 = (_func_void_j_compress_ptr_boolean *)((long)p_Var19 << 8);
                  iVar22 = iVar17 + -8;
                  bVar8 = 0xf < iVar17;
                  sVar16 = local_c0._8_8_;
                  iVar17 = iVar22;
                } while (bVar8);
              }
              stack0xffffffffffffff58 =
                   (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)CONCAT44(iStack_a4,iVar22);
              local_c0._16_8_ = p_Var19;
              goto LAB_001e2b9b;
            }
          }
          local_78 = CONCAT44(local_78._4_4_,(int)(*local_58)[local_60[lVar13]]);
          local_70 = uVar20;
          uVar23 = uVar24;
          if (0xf < uVar24) {
            do {
              uVar9 = local_c0._16_8_;
              uVar24 = *(uint *)(local_68 + 0x3c0);
              cVar2 = local_68[0x4f0];
              iVar22 = (int)(char)cVar2;
              if (cVar2 == (code)0x0) {
                pjVar6 = local_90->err;
                pjVar6->msg_code = 0x29;
                local_88 = CONCAT44(local_88._4_4_,(int)(char)cVar2);
                (*pjVar6->error_exit)((j_common_ptr)local_90);
                iVar22 = (int)local_88;
              }
              uVar11 = uVar11 + iVar22;
              p_Var19 = (_func_void_j_compress_ptr_boolean *)
                        (uVar9 | (ulong)(uVar24 & ~(uint)(-1L << ((byte)iVar22 & 0x3f))) <<
                                 (0x18U - (char)uVar11 & 0x3f));
              uVar24 = uVar11;
              if (7 < (int)uVar11) {
                do {
                  pJVar14 = (JOCTET *)(local_c0._0_8_ + 1);
                  *(JOCTET *)local_c0._0_8_ = (JOCTET)((ulong)p_Var19 >> 0x10);
                  local_c0._8_8_ = local_c0._8_8_ - 1;
                  local_c0._0_8_ = pJVar14;
                  if (local_c0._8_8_ == 0) {
                    pjVar7 = local_90->dest;
                    bVar12 = (*pjVar7->empty_output_buffer)(local_90);
                    if (bVar12 == 0) {
                      return 0;
                    }
                    local_c0._0_8_ = pjVar7->next_output_byte;
                    local_c0._8_8_ = pjVar7->free_in_buffer;
                  }
                  if ((~(uint)p_Var19 & 0xff0000) == 0) {
                    pJVar14 = (JOCTET *)(local_c0._0_8_ + 1);
                    *(JOCTET *)local_c0._0_8_ = '\0';
                    local_c0._8_8_ = local_c0._8_8_ - 1;
                    local_c0._0_8_ = pJVar14;
                    if (local_c0._8_8_ == 0) {
                      pjVar7 = local_90->dest;
                      bVar12 = (*pjVar7->empty_output_buffer)(local_90);
                      if (bVar12 == 0) {
                        return 0;
                      }
                      local_c0._0_8_ = pjVar7->next_output_byte;
                      local_c0._8_8_ = pjVar7->free_in_buffer;
                    }
                  }
                  p_Var19 = (_func_void_j_compress_ptr_boolean *)((long)p_Var19 << 8);
                  uVar11 = uVar24 - 8;
                  bVar8 = 0xf < uVar24;
                  sVar16 = local_c0._8_8_;
                  uVar24 = uVar11;
                } while (bVar8);
              }
              stack0xffffffffffffff58 =
                   (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)CONCAT44(iStack_a4,uVar11);
              uVar24 = uVar23 - 0x10;
              bVar8 = 0x1f < (int)uVar23;
              uVar23 = uVar24;
              local_c0._16_8_ = p_Var19;
            } while (bVar8);
          }
          uVar9 = local_c0._16_8_;
          uVar23 = -(uint)local_78;
          if (0 < (int)(uint)local_78) {
            uVar23 = (uint)local_78;
          }
          iVar22 = 1;
          if (1 < uVar23) {
            uVar15 = 0x1f;
            if (uVar23 != 0) {
              for (; uVar23 >> uVar15 == 0; uVar15 = uVar15 - 1) {
              }
            }
            iVar22 = (uVar15 ^ 0xffffffe0) + 0x21;
            if (0x3ff < uVar23) {
              pjVar6 = local_90->err;
              pjVar6->msg_code = 6;
              (*pjVar6->error_exit)((j_common_ptr)local_90);
            }
          }
          local_88 = CONCAT44(local_88._4_4_,iVar22);
          lVar13 = (long)(int)(uVar24 * 0x10 + iVar22);
          uVar24 = *(uint *)(local_68 + lVar13 * 4);
          bVar1 = (byte)local_68[lVar13 + 0x400];
          if (bVar1 == 0) {
            pjVar6 = local_90->err;
            pjVar6->msg_code = 0x29;
            (*pjVar6->error_exit)((j_common_ptr)local_90);
          }
          iVar22 = uVar11 + (int)(char)bVar1;
          uVar20 = uVar9 | (ulong)(uVar24 & ~(uint)(-1L << (bVar1 & 0x3f))) <<
                           (0x18U - (char)iVar22 & 0x3f);
          iVar17 = iVar22;
          if (7 < iVar22) {
            do {
              pJVar14 = (JOCTET *)(local_c0._0_8_ + 1);
              *(JOCTET *)local_c0._0_8_ = (JOCTET)(uVar20 >> 0x10);
              local_c0._8_8_ = local_c0._8_8_ - 1;
              local_c0._0_8_ = pJVar14;
              if (local_c0._8_8_ == 0) {
                pjVar7 = local_90->dest;
                bVar12 = (*pjVar7->empty_output_buffer)(local_90);
                if (bVar12 == 0) {
                  return 0;
                }
                local_c0._0_8_ = pjVar7->next_output_byte;
                local_c0._8_8_ = pjVar7->free_in_buffer;
              }
              if ((~(uint)uVar20 & 0xff0000) == 0) {
                pJVar14 = (JOCTET *)(local_c0._0_8_ + 1);
                *(JOCTET *)local_c0._0_8_ = '\0';
                local_c0._8_8_ = local_c0._8_8_ - 1;
                local_c0._0_8_ = pJVar14;
                if (local_c0._8_8_ == 0) {
                  pjVar7 = local_90->dest;
                  bVar12 = (*pjVar7->empty_output_buffer)(local_90);
                  if (bVar12 == 0) {
                    return 0;
                  }
                  local_c0._0_8_ = pjVar7->next_output_byte;
                  local_c0._8_8_ = pjVar7->free_in_buffer;
                }
              }
              uVar20 = uVar20 << 8;
              iVar22 = iVar17 + -8;
              bVar8 = 0xf < iVar17;
              sVar16 = local_c0._8_8_;
              iVar17 = iVar22;
            } while (bVar8);
          }
          uVar11 = iVar22 + (int)local_88;
          p_Var19 = (_func_void_j_compress_ptr_boolean *)
                    ((ulong)(~(uint)(-1L << ((byte)local_88 & 0x3f)) &
                            ((int)(uint)local_78 >> 0xf) + (uint)local_78) <<
                     (0x18U - (char)uVar11 & 0x3f) | uVar20);
          uVar24 = uVar11;
          if (7 < (int)uVar11) {
            do {
              pJVar14 = (JOCTET *)(local_c0._0_8_ + 1);
              *(JOCTET *)local_c0._0_8_ = (JOCTET)((ulong)p_Var19 >> 0x10);
              local_c0._8_8_ = local_c0._8_8_ - 1;
              local_c0._0_8_ = pJVar14;
              if (local_c0._8_8_ == 0) {
                pjVar7 = local_90->dest;
                bVar12 = (*pjVar7->empty_output_buffer)(local_90);
                if (bVar12 == 0) {
                  return 0;
                }
                local_c0._0_8_ = pjVar7->next_output_byte;
                local_c0._8_8_ = pjVar7->free_in_buffer;
              }
              if ((~(uint)p_Var19 & 0xff0000) == 0) {
                pJVar14 = (JOCTET *)(local_c0._0_8_ + 1);
                *(JOCTET *)local_c0._0_8_ = '\0';
                local_c0._8_8_ = local_c0._8_8_ - 1;
                local_c0._0_8_ = pJVar14;
                if (local_c0._8_8_ == 0) {
                  pjVar7 = local_90->dest;
                  bVar12 = (*pjVar7->empty_output_buffer)(local_90);
                  if (bVar12 == 0) {
                    return 0;
                  }
                  local_c0._0_8_ = pjVar7->next_output_byte;
                  local_c0._8_8_ = pjVar7->free_in_buffer;
                }
              }
              p_Var19 = (_func_void_j_compress_ptr_boolean *)((long)p_Var19 << 8);
              uVar11 = uVar24 - 8;
              bVar8 = 0xf < (int)uVar24;
              sVar16 = local_c0._8_8_;
              uVar24 = uVar11;
            } while (bVar8);
          }
          stack0xffffffffffffff58 =
               (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)CONCAT44(iStack_a4,uVar11);
          uVar20 = local_70;
          local_c0._16_8_ = p_Var19;
        } while (local_70 + lVar18 != 0);
      }
LAB_001e2b9b:
      MCU_data = local_80;
      (&iStack_a4)[local_40] = (int)(*local_80[local_38])[0];
      local_38 = local_38 + 1;
      cinfo = local_50;
    } while (local_38 < local_50->blocks_in_MCU);
  }
  pjVar7 = cinfo->dest;
  pjVar7->next_output_byte = (JOCTET *)local_c0._0_8_;
  pjVar7->free_in_buffer = sVar16;
  local_48[1].finish_pass = local_a0;
  local_48[2].start_pass = p_Stack_98;
  local_48[1].start_pass = (_func_void_j_compress_ptr_boolean *)local_c0._16_8_;
  local_48[1].encode_mcu = stack0xffffffffffffff58;
  uVar24 = cinfo->restart_interval;
  if (uVar24 != 0) {
    uVar23 = *(uint *)&local_48[2].encode_mcu;
    if (*(uint *)&local_48[2].encode_mcu == 0) {
      *(uint *)((long)&local_48[2].encode_mcu + 4) =
           *(int *)((long)&local_48[2].encode_mcu + 4) + 1U & 7;
      uVar23 = uVar24;
    }
    *(uint *)&local_48[2].encode_mcu = uVar23 - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_huff (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  working_state state;
  int blkn, ci;
  jpeg_component_info * compptr;

  /* Load up working state */
  state.next_output_byte = cinfo->dest->next_output_byte;
  state.free_in_buffer = cinfo->dest->free_in_buffer;
  ASSIGN_STATE(state.cur, entropy->saved);
  state.cinfo = cinfo;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! emit_restart_s(&state, entropy->next_restart_num))
	return FALSE;
  }

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];
    if (! encode_one_block(&state,
			   MCU_data[blkn][0], state.cur.last_dc_val[ci],
			   entropy->dc_derived_tbls[compptr->dc_tbl_no],
			   entropy->ac_derived_tbls[compptr->ac_tbl_no]))
      return FALSE;
    /* Update last_dc_val */
    state.cur.last_dc_val[ci] = MCU_data[blkn][0][0];
  }

  /* Completed MCU, so update state */
  cinfo->dest->next_output_byte = state.next_output_byte;
  cinfo->dest->free_in_buffer = state.free_in_buffer;
  ASSIGN_STATE(entropy->saved, state.cur);

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}